

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O3

void __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
::push_back(cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
            *this,range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                  *r)

{
  pointer *ppeVar1;
  iterator iVar2;
  size_t sVar3;
  
  this->_nranges = this->_nranges + 1;
  iVar2._M_current =
       (this->_begins).
       super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->_begins).
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<tchecker::system::edges_collection_const_iterator_t,std::allocator<tchecker::system::edges_collection_const_iterator_t>>
    ::_M_realloc_insert<tchecker::system::edges_collection_const_iterator_t_const&>
              ((vector<tchecker::system::edges_collection_const_iterator_t,std::allocator<tchecker::system::edges_collection_const_iterator_t>>
                *)&this->_begins,iVar2,&r->_begin);
  }
  else {
    ((iVar2._M_current)->super_const_iterator)._M_current =
         (r->_begin).super_const_iterator._M_current;
    ppeVar1 = &(this->_begins).
               super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppeVar1 = *ppeVar1 + 1;
  }
  iVar2._M_current =
       (this->_ends).
       super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->_ends).
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<tchecker::system::edges_collection_const_iterator_t,std::allocator<tchecker::system::edges_collection_const_iterator_t>>
    ::_M_realloc_insert<tchecker::system::edges_collection_const_iterator_t_const&>
              ((vector<tchecker::system::edges_collection_const_iterator_t,std::allocator<tchecker::system::edges_collection_const_iterator_t>>
                *)&this->_ends,iVar2,&r->_end);
  }
  else {
    ((iVar2._M_current)->super_const_iterator)._M_current =
         (r->_end).super_const_iterator._M_current;
    ppeVar1 = &(this->_ends).
               super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppeVar1 = *ppeVar1 + 1;
  }
  iVar2._M_current =
       (this->_its).
       super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->_its).
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<tchecker::system::edges_collection_const_iterator_t,std::allocator<tchecker::system::edges_collection_const_iterator_t>>
    ::_M_realloc_insert<tchecker::system::edges_collection_const_iterator_t_const&>
              ((vector<tchecker::system::edges_collection_const_iterator_t,std::allocator<tchecker::system::edges_collection_const_iterator_t>>
                *)&this->_its,iVar2,&r->_begin);
  }
  else {
    ((iVar2._M_current)->super_const_iterator)._M_current =
         (r->_begin).super_const_iterator._M_current;
    ppeVar1 = &(this->_its).
               super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppeVar1 = *ppeVar1 + 1;
  }
  sVar3 = this->_nranges;
  if (sVar3 != 0 &&
      (r->_begin).super_const_iterator._M_current == (r->_end).super_const_iterator._M_current) {
    (((this->_its).
      super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
      ._M_impl.super__Vector_impl_data._M_start)->super_const_iterator)._M_current =
         (((this->_ends).
           super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
           ._M_impl.super__Vector_impl_data._M_start)->super_const_iterator)._M_current;
    sVar3 = this->_nranges;
  }
  if (sVar3 != (long)(this->_begins).
                     super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_begins).
                     super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) {
    __assert_fail("_nranges == _begins.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1fd,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::push_back(const R &) [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  if (sVar3 != (long)(this->_ends).
                     super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_ends).
                     super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) {
    __assert_fail("_nranges == _ends.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x1fe,
                  "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::push_back(const R &) [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  if (sVar3 == (long)(this->_its).
                     super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_its).
                     super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) {
    return;
  }
  __assert_fail("_nranges == _its.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                ,0x1ff,
                "void tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::push_back(const R &) [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
               );
}

Assistant:

void push_back(R const & r)
  {
    ++_nranges;
    _begins.push_back(r.begin());
    _ends.push_back(r.end());
    _its.push_back(r.begin());

    if (r.empty()) // detect empty cartesian product
      to_end();

    assert(_nranges == _begins.size());
    assert(_nranges == _ends.size());
    assert(_nranges == _its.size());
  }